

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

void __thiscall
CommandInInventory::ParseNegatable(CommandInInventory *this,FScanner *sc,bool fullScreenOffsets)

{
  bool bVar1;
  bool bVar2;
  PClassActor *pPVar3;
  long lVar4;
  
  bVar1 = FScanner::CheckToken(sc,0x102);
  if (!bVar1) {
    FScanner::MustGetToken(sc,0x101);
  }
  lVar4 = 0;
  bVar1 = true;
  do {
    pPVar3 = PClass::FindActor(sc->String);
    this->item[lVar4] = pPVar3;
    if (pPVar3 == (PClassActor *)0x0) {
LAB_00627f30:
      FScanner::ScriptMessage(sc,"\'%s\' is not a type of inventory item.",sc->String);
      this->item[lVar4] = (PClassActor *)AInventory::RegistrationInfo.MyClass;
    }
    else if (pPVar3 != (PClassActor *)AInventory::RegistrationInfo.MyClass) {
      do {
        pPVar3 = (PClassActor *)(pPVar3->super_PClass).ParentClass;
        if (pPVar3 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
      } while (pPVar3 != (PClassActor *)0x0);
      if (pPVar3 == (PClassActor *)0x0) goto LAB_00627f30;
    }
    bVar2 = FScanner::CheckToken(sc,0x2c);
    if (bVar2) {
      FScanner::MustGetNumber(sc);
      this->amount[lVar4] = sc->Number;
    }
    bVar2 = FScanner::CheckToken(sc,0x11c);
    if (bVar2) {
      this->conditionAnd = false;
    }
    else {
      bVar2 = FScanner::CheckToken(sc,0x11b);
      if (!bVar2) {
        return;
      }
      this->conditionAnd = true;
    }
    bVar2 = FScanner::CheckToken(sc,0x102);
    if (!bVar2) {
      FScanner::MustGetToken(sc,0x101);
    }
    lVar4 = 1;
    bVar2 = !bVar1;
    bVar1 = false;
    if (bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void	ParseNegatable(FScanner &sc, bool fullScreenOffsets)
		{
			if(!sc.CheckToken(TK_StringConst))
				sc.MustGetToken(TK_Identifier);
			for(int i = 0;i < 2;i++)
			{
				item[i] = PClass::FindActor(sc.String);
				if(item[i] == NULL || !RUNTIME_CLASS(AInventory)->IsAncestorOf(item[i]))
				{
					sc.ScriptMessage("'%s' is not a type of inventory item.", sc.String);
					item[i] = RUNTIME_CLASS(AInventory);
				}
		
				if (sc.CheckToken(','))
				{
					sc.MustGetNumber();
					amount[i] = sc.Number;
				}
		
				if(sc.CheckToken(TK_OrOr))
				{
					conditionAnd = false;
					if(!sc.CheckToken(TK_StringConst))
						sc.MustGetToken(TK_Identifier);
				}
				else if(sc.CheckToken(TK_AndAnd))
				{
					conditionAnd = true;
					if(!sc.CheckToken(TK_StringConst))
						sc.MustGetToken(TK_Identifier);
				}
				else
					break;
			}
		}